

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O0

void * coll_seq_insert_at(coll_seq_t *seq,void *data,size_t index)

{
  coll_seq_node_t *pcVar1;
  node_t_conflict *node;
  size_t i;
  node_t_conflict *cur;
  node_t_conflict *prev;
  size_t index_local;
  void *data_local;
  coll_seq_t *seq_local;
  
  if ((seq == (coll_seq_t *)0x0) || (seq->len < index)) {
    seq_local = (coll_seq_t *)0x0;
  }
  else if (index == seq->len) {
    seq_local = (coll_seq_t *)coll_seq_append(seq,data);
  }
  else {
    cur = (node_t_conflict *)0x0;
    i = (size_t)seq->head;
    for (node = (node_t_conflict *)0x0; node < index;
        node = (node_t_conflict *)((long)&node->data + 1)) {
      cur = (node_t_conflict *)i;
      i = *(size_t *)(i + 8);
    }
    pcVar1 = (coll_seq_node_t *)malloc(0x10);
    pcVar1->data = data;
    pcVar1->next = (coll_seq_node_t *)i;
    if (cur == (node_t_conflict *)0x0) {
      seq->head = pcVar1;
    }
    else {
      cur->next = pcVar1;
    }
    seq->len = seq->len + 1;
    seq_local = (coll_seq_t *)data;
  }
  return seq_local;
}

Assistant:

void *coll_seq_insert_at(coll_seq_t *seq, void *data, size_t index) {
    if (!seq || index > seq->len) {
        return NULL;
    } else if (index == seq->len) {
        return coll_seq_append(seq, data);
    }
    node_t *prev = NULL, *cur = seq->head;
    for (size_t i = 0; i < index; ++i) {
        prev = cur;
        cur = cur->next;
    }
    node_t *node = malloc(sizeof(node_t));
    node->data = data;
    node->next = cur;
    if (prev) {
        prev->next = node;
    } else {
        seq->head = node;
    }
    ++(seq->len);
    return data;
}